

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_sei.c
# Opt level: O0

RK_S32 decode_nal_sei_alternative_transfer(HEVCContext *s,BitReadCtx_t *gb)

{
  MPP_RET MVar1;
  RK_S32 local_30 [2];
  RK_S32 _out;
  RK_S32 val;
  HEVCSEIAlternativeTransfer *alternative_transfer;
  BitReadCtx_t *gb_local;
  HEVCContext *s_local;
  
  __out = &s->alternative_transfer;
  alternative_transfer = (HEVCSEIAlternativeTransfer *)gb;
  gb_local = (BitReadCtx_t *)s;
  MVar1 = mpp_read_bits(gb,8,local_30);
  alternative_transfer[8].preferred_transfer_characteristics = MVar1;
  if (alternative_transfer[8].preferred_transfer_characteristics == 0) {
    __out->present = 1;
    __out->preferred_transfer_characteristics = local_30[0];
    *(undefined4 *)((long)&gb_local[0x6cf].buf + 4) = 1;
    s_local._4_4_ = 0;
  }
  else {
    s_local._4_4_ = -0x3ec;
  }
  return s_local._4_4_;
}

Assistant:

static RK_S32 decode_nal_sei_alternative_transfer(HEVCContext *s, BitReadCtx_t *gb)
{
    HEVCSEIAlternativeTransfer *alternative_transfer = &s->alternative_transfer;
    RK_S32 val;

    READ_BITS(gb, 8, &val);
    alternative_transfer->present = 1;
    alternative_transfer->preferred_transfer_characteristics = val;
    s->is_hdr = 1;
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}